

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_mix_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t left,uint32_t right,
          uint32_t lerp)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  SPIRType *pSVar5;
  SPIRType *type;
  string mix_op;
  string expr;
  string local_70;
  string local_50;
  
  pSVar5 = Compiler::expression_type(&this->super_Compiler,lerp);
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    result_type);
  if (type->pointer == true) {
    Compiler::register_write(&this->super_Compiler,left);
    Compiler::register_write(&this->super_Compiler,right);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (*(this->backend).boolean_mix_function == '\0') {
    bVar3 = 0;
  }
  else {
    bVar4 = (this->options).es;
    uVar1 = (this->options).version;
    bVar3 = 1;
    if ((bVar4 & 0x135 < uVar1) == 0) {
      bVar3 = ~bVar4 & 0x1c1 < uVar1;
    }
  }
  bVar4 = to_trivial_mix_op(this,type,&local_70,left,right,lerp);
  if (bVar4) {
    emit_unary_func_op(this,result_type,id,lerp,local_70._M_dataplus._M_p);
    goto LAB_001c8b0f;
  }
  iVar2 = *(int *)&(pSVar5->super_IVariant).field_0xc;
  if (iVar2 != 2 || (pSVar5->vecsize != 1 & bVar3) != 0) {
    if (iVar2 == 2) {
      emit_trinary_func_op(this,result_type,id,left,right,lerp,(this->backend).boolean_mix_function)
      ;
    }
    else {
      emit_trinary_func_op(this,result_type,id,left,right,lerp,"mix");
    }
    goto LAB_001c8b0f;
  }
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  to_ternary_expression_abi_cxx11_(&local_50,this,pSVar5,lerp,right,left);
  bVar4 = should_forward(this,left);
  if (bVar4) {
    bVar4 = should_forward(this,right);
    if (!bVar4) goto LAB_001c8a94;
    bVar4 = should_forward(this,lerp);
  }
  else {
LAB_001c8a94:
    bVar4 = false;
  }
  emit_op(this,result_type,id,&local_50,bVar4,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,id,left);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,id,right);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,id,lerp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_001c8b0f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_mix_op(uint32_t result_type, uint32_t id, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto &lerptype = expression_type(lerp);
	auto &restype = get<SPIRType>(result_type);

	// If this results in a variable pointer, assume it may be written through.
	if (restype.pointer)
	{
		register_write(left);
		register_write(right);
	}

	string mix_op;
	bool has_boolean_mix = *backend.boolean_mix_function &&
	                       ((options.es && options.version >= 310) || (!options.es && options.version >= 450));
	bool trivial_mix = to_trivial_mix_op(restype, mix_op, left, right, lerp);

	// Cannot use boolean mix when the lerp argument is just one boolean,
	// fall back to regular trinary statements.
	if (lerptype.vecsize == 1)
		has_boolean_mix = false;

	// If we can reduce the mix to a simple cast, do so.
	// This helps for cases like int(bool), uint(bool) which is implemented with
	// OpSelect bool 1 0.
	if (trivial_mix)
	{
		emit_unary_func_op(result_type, id, lerp, mix_op.c_str());
	}
	else if (!has_boolean_mix && lerptype.basetype == SPIRType::Boolean)
	{
		// Boolean mix not supported on desktop without extension.
		// Was added in OpenGL 4.5 with ES 3.1 compat.
		//
		// Could use GL_EXT_shader_integer_mix on desktop at least,
		// but Apple doesn't support it. :(
		// Just implement it as ternary expressions.
		auto expr = to_ternary_expression(get<SPIRType>(result_type), lerp, right, left);
		emit_op(result_type, id, expr, should_forward(left) && should_forward(right) && should_forward(lerp));
		inherit_expression_dependencies(id, left);
		inherit_expression_dependencies(id, right);
		inherit_expression_dependencies(id, lerp);
	}
	else if (lerptype.basetype == SPIRType::Boolean)
		emit_trinary_func_op(result_type, id, left, right, lerp, backend.boolean_mix_function);
	else
		emit_trinary_func_op(result_type, id, left, right, lerp, "mix");
}